

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QJsonValue * qt_convertToJson(QCborContainerPrivate *d,qsizetype idx,ConversionMode mode)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference pEVar3;
  int in_ECX;
  QCborContainerPrivate *in_RDX;
  QCborContainerPrivate *in_RSI;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  Element *e;
  QString value;
  undefined4 in_stack_ffffffffffffff18;
  ValueFlag in_stack_ffffffffffffff1c;
  QCborValue *in_stack_ffffffffffffff20;
  QCborValue *this;
  QCborValue *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Type TVar4;
  Type type;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff4c;
  ConversionMode in_stack_ffffffffffffff54;
  QCborContainerPrivate *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  QJsonValue *pQVar6;
  ConversionMode CVar7;
  qsizetype in_stack_ffffffffffffff80;
  QCborContainerPrivate *in_stack_ffffffffffffff88;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QCborContainerPrivate *)0xffffffffffffff80) {
    convertToJsonArray(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    QJsonValue::QJsonValue
              ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (QJsonArray *)in_stack_ffffffffffffff28);
    QJsonArray::~QJsonArray((QJsonArray *)0x4888a9);
    goto LAB_00488d34;
  }
  if (in_RDX == (QCborContainerPrivate *)0xffffffffffffff60) {
    convertToJsonObject(in_RSI,~FromRaw);
    QJsonValue::QJsonValue
              ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (QJsonObject *)in_stack_ffffffffffffff28);
    QJsonObject::~QJsonObject((QJsonObject *)0x4888ee);
    goto LAB_00488d34;
  }
  if ((long)in_RDX < 0) {
    if ((in_RSI == (QCborContainerPrivate *)0x0) ||
       (qVar2 = QList<QtCbor::Element>::size(&in_RSI->elements), qVar2 != 2)) {
      QJsonValue::QJsonValue
                ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (Type)((ulong)in_RDI >> 0x20));
    }
    else {
      convertExtendedTypeToJson((QCborContainerPrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffff60))
      ;
    }
    goto LAB_00488d34;
  }
  pQVar6 = in_RDI;
  pEVar3 = QList<QtCbor::Element>::at
                     ((QList<QtCbor::Element> *)in_stack_ffffffffffffff20,
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  TVar4 = pEVar3->type;
  type = (Type)((ulong)in_RDI >> 0x20);
  if (TVar4 == Invalid) {
LAB_00488c48:
    QJsonValue::QJsonValue
              ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),type);
    goto LAB_00488d34;
  }
  if (TVar4 == Integer) {
    QJsonValue::QJsonValue
              ((QJsonValue *)in_stack_ffffffffffffff20,
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    goto LAB_00488d34;
  }
  CVar7 = (ConversionMode)((ulong)pQVar6 >> 0x20);
  if (TVar4 == ByteArray) {
    if (in_ECX == 1) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      makeString(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,CVar7);
      bVar1 = QString::isEmpty((QString *)0x488af2);
      uVar5 = 0;
      if (bVar1) {
        QJsonValue::QJsonValue
                  ((QJsonValue *)
                   (CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48) &
                   0xffffffff00ffffff),(Type)((ulong)in_RDI >> 0x20));
      }
      else {
        QCborValue::QCborValue
                  ((QCborValue *)CONCAT44(TVar4,in_stack_ffffffffffffff30),
                   (QString *)in_stack_ffffffffffffff28);
        uVar5 = 0x1000000;
        QJsonPrivate::Value::fromTrustedCbor(in_stack_ffffffffffffff28);
      }
      if ((uVar5 & 0x1000000) != 0) {
        QCborValue::~QCborValue(in_stack_ffffffffffffff20);
      }
      QString::~QString((QString *)0x488b62);
      goto LAB_00488d34;
    }
  }
  else if (TVar4 != String) {
    if (((TVar4 == Array) || (TVar4 == Map)) || (TVar4 == Tag)) goto LAB_00488bde;
    if (TVar4 != SimpleType) {
      bVar1 = SUB41(in_stack_ffffffffffffff1c >> 0x18,0);
      if (TVar4 == False) {
        QJsonValue::QJsonValue((QJsonValue *)in_stack_ffffffffffffff20,bVar1);
        goto LAB_00488d34;
      }
      if (TVar4 == True) {
        QJsonValue::QJsonValue((QJsonValue *)in_stack_ffffffffffffff20,bVar1);
        goto LAB_00488d34;
      }
      if ((uint)(TVar4 + ~True) < 2) goto LAB_00488c48;
      if (TVar4 == Double) {
        QtCbor::Element::fpvalue((Element *)in_stack_ffffffffffffff20);
        fpToJson((double)in_stack_ffffffffffffff28);
        goto LAB_00488d34;
      }
      if ((TVar4 == DateTime) || (TVar4 == Url)) {
LAB_00488bde:
        local_64.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
             (QFlagsStorage<QtCbor::Element::ValueFlag>)
             QFlags<QtCbor::Element::ValueFlag>::operator&
                       ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c);
        CVar7 = (ConversionMode)((ulong)pEVar3 >> 0x20);
        QFlags::operator_cast_to_bool((QFlags *)&local_64);
        qt_convertToJson(in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffff60),CVar7);
        goto LAB_00488d34;
      }
      if (TVar4 == RegularExpression) {
        if (in_ECX == 1) {
          QJsonValue::QJsonValue
                    ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     type);
          goto LAB_00488d34;
        }
      }
      else if (TVar4 == Uuid) goto LAB_00488bde;
    }
  }
  this = (QCborValue *)&stack0xffffffffffffff80;
  makeString(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,CVar7);
  QCborValue::QCborValue
            ((QCborValue *)CONCAT44(TVar4,in_stack_ffffffffffffff30),
             (QString *)in_stack_ffffffffffffff28);
  QJsonPrivate::Value::fromTrustedCbor(in_stack_ffffffffffffff28);
  QCborValue::~QCborValue(this);
  QString::~QString((QString *)0x488cf3);
LAB_00488d34:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue qt_convertToJson(QCborContainerPrivate *d, qsizetype idx, ConversionMode mode)
{
    // encoding the container itself
    if (idx == -QCborValue::Array)
        return convertToJsonArray(d, mode);
    if (idx == -QCborValue::Map)
        return convertToJsonObject(d, mode);
    if (idx < 0) {
        // tag-like type
        if (!d || d->elements.size() != 2)
            return QJsonValue::Undefined;   // invalid state
        return convertExtendedTypeToJson(d);
    }

    // an element in the container
    const auto &e = d->elements.at(idx);
    switch (e.type) {
    case QCborValue::Integer:
        return QJsonValue(e.value);
    case QCborValue::ByteArray:
        if (mode == ConversionMode::FromVariantToJson) {
            const auto value = makeString(d, idx, mode);
            return value.isEmpty() ? QJsonValue() : QJsonPrivate::Value::fromTrustedCbor(value);
        }
        break;
    case QCborValue::RegularExpression:
        if (mode == ConversionMode::FromVariantToJson)
            return QJsonValue();
        break;
    case QCborValue::String:
    case QCborValue::SimpleType:
        // make string
        break;

    case QCborValue::Array:
    case QCborValue::Map:
    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::Uuid:
        // recurse
        return qt_convertToJson(e.flags & Element::IsContainer ? e.container : nullptr, -e.type,
                                mode);

    case QCborValue::Null:
    case QCborValue::Undefined:
    case QCborValue::Invalid:
        return QJsonValue();

    case QCborValue::False:
        return false;

    case QCborValue::True:
        return true;

    case QCborValue::Double:
        return fpToJson(e.fpvalue());
    }

    return QJsonPrivate::Value::fromTrustedCbor(makeString(d, idx, mode));
}